

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsServerThread::set_run_state(TadsServerThread *this,char *s)

{
  TadsServerThread *this_00;
  StringRef *in_RSI;
  StringRef *in_RDI;
  StringRef *r;
  char *in_stack_ffffffffffffffe8;
  
  this_00 = (TadsServerThread *)operator_new(0x28);
  StringRef::StringRef(in_RSI,in_stack_ffffffffffffffe8);
  set_run_state(this_00,in_RDI);
  CVmRefCntObj::release_ref((CVmRefCntObj *)this_00);
  return;
}

Assistant:

void set_run_state(const char *s)
    {
        /* set up a StringRef for the string */
        StringRef *r = new StringRef(s);

        /* set it as the new state */
        set_run_state(r);

        /* done with our reference to the new StringRef */
        r->release_ref();
    }